

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O3

result_type __thiscall
trng::correlated_normal_dist<double>::operator()(correlated_normal_dist<double> *this,lcg64 *r)

{
  iterator __position;
  pointer pdVar1;
  size_type sVar2;
  ulong uVar3;
  double *pdVar4;
  size_type sVar5;
  long lVar6;
  result_type rVar7;
  double local_18;
  
  uVar3 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar3;
  local_18 = math::detail::inv_Phi<double>
                       ((double)(uVar3 >> 1) * 1.084202172485504e-19 + 2.220446049250313e-16);
  __position._M_current =
       (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->normal_,__position,&local_18);
    pdVar4 = (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = local_18;
    pdVar4 = __position._M_current + 1;
    (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar4;
  }
  pdVar1 = (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)pdVar4 - (long)pdVar1 == 0) {
    rVar7 = 0.0;
  }
  else {
    sVar5 = (long)pdVar4 - (long)pdVar1 >> 3;
    sVar2 = (this->P).d_;
    rVar7 = 0.0;
    lVar6 = 0;
    do {
      rVar7 = rVar7 + (this->P).H_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(sVar5 - 1) * sVar2 + lVar6] * pdVar1[lVar6];
      lVar6 = lVar6 + 1;
    } while (sVar5 + (sVar5 == 0) != lVar6);
    if (sVar5 == sVar2) {
      (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar1;
    }
  }
  return rVar7;
}

Assistant:

result_type operator()(R &r) {
      normal_.push_back(trng::math::inv_Phi(utility::uniformoo<result_type>(r)));
      result_type y{P.H_times(normal_)};
      if (normal_.size() == P.d())
        normal_.clear();
      return y;
    }